

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  string *this_00;
  ostringstream ostr;
  allocator local_1fc;
  allocator local_1fb;
  allocator local_1fa;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198 [11];
  
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((-1 < this->FileLine) && (iVar3 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar3 == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::ostream::_M_insert<long>((long)local_198);
    std::__cxx11::stringbuf::str();
    pcVar4 = AddString(this,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    return pcVar4;
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)local_198,var,(allocator *)&local_1f8);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,local_198);
  std::__cxx11::string::~string((string *)local_198);
  if (pcVar4 == (char *)0x0) {
    if (this->RemoveEmpty == false) {
      if (this->WarnUninitialized != true) {
        return (char *)0x0;
      }
      pcVar1 = this->Makefile;
      std::__cxx11::string::string((string *)local_198,var,(allocator *)&local_1f8);
      bVar2 = cmMakefile::VariableInitialized(pcVar1,local_198);
      std::__cxx11::string::~string((string *)local_198);
      if (bVar2) {
        return (char *)0x0;
      }
      if (this->CheckSystemVars == false) {
        std::__cxx11::string::string((string *)local_198,this->FileName,&local_1f9);
        pcVar4 = cmMakefile::GetHomeDirectory(this->Makefile);
        std::__cxx11::string::string((string *)&local_1f8,pcVar4,&local_1fa);
        bVar2 = cmsys::SystemTools::IsSubDirectory(local_198,&local_1f8);
        if (bVar2) {
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)local_198);
        }
        else {
          std::__cxx11::string::string((string *)&local_1d8,this->FileName,&local_1fb);
          pcVar4 = cmMakefile::GetHomeOutputDirectory(this->Makefile);
          std::__cxx11::string::string((string *)&local_1b8,pcVar4,&local_1fc);
          bVar2 = cmsys::SystemTools::IsSubDirectory(&local_1d8,&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)local_198);
          if (!bVar2) {
            return (char *)0x0;
          }
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      poVar5 = std::operator<<((ostream *)local_198,"uninitialized variable \'");
      poVar5 = std::operator<<(poVar5,var);
      std::operator<<(poVar5,"\'");
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      return (char *)0x0;
    }
    pcVar4 = "";
  }
  else if (this->EscapeQuotes == true) {
    std::__cxx11::string::string((string *)&local_1f8,pcVar4,(allocator *)&local_1d8);
    cmSystemTools::EscapeQuotes(local_198,&local_1f8);
    pcVar4 = AddString(this,local_198);
    std::__cxx11::string::~string((string *)local_198);
    this_00 = &local_1f8;
    goto LAB_00401150;
  }
  std::__cxx11::string::string((string *)local_198,pcVar4,(allocator *)&local_1f8);
  pcVar4 = AddString(this,local_198);
  this_00 = local_198;
LAB_00401150:
  std::__cxx11::string::~string((string *)this_00);
  return pcVar4;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return CM_NULLPTR;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
  }
  const char* value = this->Makefile->GetDefinition(var);
  if (!value && !this->RemoveEmpty) {
    // check to see if we need to print a warning
    // if strict mode is on and the variable has
    // not been "cleared"/initialized with a set(foo ) call
    if (this->WarnUninitialized && !this->Makefile->VariableInitialized(var)) {
      if (this->CheckSystemVars ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                        this->Makefile->GetHomeDirectory()) ||
          cmSystemTools::IsSubDirectory(
            this->FileName, this->Makefile->GetHomeOutputDirectory())) {
        std::ostringstream msg;
        msg << "uninitialized variable \'" << var << "\'";
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
      }
    }
    return CM_NULLPTR;
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
  }
  return this->AddString(value ? value : "");
}